

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O2

void __thiscall
libtorrent::natpmp::natpmp
          (natpmp *this,io_context *ios,portmap_callback *cb,listen_socket_handle *ls)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_enable_shared_from_this<libtorrent::natpmp>)._M_weak_this.
  super___weak_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<libtorrent::natpmp>)._M_weak_this.
  super___weak_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_callback = cb;
  this->m_version = version_pcp;
  (this->m_mappings).
  super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>.
  super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mappings).
  super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>.
  super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mappings).
  super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>.
  super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)&(this->m_nat_endpoint).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->m_nat_endpoint).impl_.data_ + 0x10) = 0;
  (this->m_nat_endpoint).impl_.data_.v6.sin6_scope_id = 0;
  *(undefined8 *)&(this->m_nat_endpoint).impl_.data_ = 2;
  this->m_currently_mapping = -1;
  this->m_retry_count = 0;
  (this->m_external_ip).type_ = ipv4;
  (this->m_external_ip).ipv4_address_ = (in4_addr_type)0x0;
  *(undefined8 *)&(this->m_external_ip).ipv6_address_.addr_.__in6_u = 0;
  *(undefined8 *)((long)&(this->m_external_ip).ipv6_address_.addr_.__in6_u + 8) = 0;
  (this->m_external_ip).ipv6_address_.scope_id_ = 0;
  (this->m_remote).impl_.data_.v6.sin6_scope_id = 0;
  *(undefined8 *)((long)&(this->m_remote).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->m_remote).impl_.data_ + 0x10) = 0;
  *(undefined8 *)&(this->m_remote).impl_.data_ = 2;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&this->m_socket,ios,(type *)0x0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->m_send_timer).impl_,ios,(type *)0x0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->m_refresh_timer).impl_,ios,(type *)0x0);
  (this->m_next_refresh).m_val = -1;
  this->m_ioc = ios;
  p_Var1 = (ls->m_sock).
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_listen_handle).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->m_listen_handle).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_disabled = false;
  this->m_abort = false;
  ::std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>::
  reserve(&(this->m_mappings).
           super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
          ,10);
  return;
}

Assistant:

natpmp::natpmp(io_context& ios
	, aux::portmap_callback& cb
	, listen_socket_handle ls)
	: m_callback(cb)
	, m_socket(ios)
	, m_send_timer(ios)
	, m_refresh_timer(ios)
	, m_ioc(ios)
	, m_listen_handle(std::move(ls))
{
	// unfortunately async operations rely on the storage
	// for this array not to be reallocated, by passing
	// around pointers to its elements. so reserve size for now
	m_mappings.reserve(10);
}